

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O3

void __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
          (SpvAsmComputeShaderCase *this,TestContext *testCtx,char *name,char *description,
          ComputeShaderSpec *spec,ComputeTestFeatures features)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,name,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,description,&local_6a);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_48[0],(char *)local_68[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d20790;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SpvAsmComputeShaderCase_00d2b520;
  ComputeShaderSpec::ComputeShaderSpec(&this->m_shaderSpec,spec);
  this->m_features = features;
  return;
}

Assistant:

SpvAsmComputeShaderCase::SpvAsmComputeShaderCase (tcu::TestContext& testCtx, const char* name, const char* description, const ComputeShaderSpec& spec, const ComputeTestFeatures features)
	: TestCase		(testCtx, name, description)
	, m_shaderSpec	(spec)
	, m_features	(features)
{
}